

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

string * __thiscall
pbrt::SpotLight::ToString_abi_cxx11_(string *__return_storage_ptr__,SpotLight *this)

{
  _Alloc_hider in_stack_ffffffffffffffc8;
  
  LightBase::BaseToString_abi_cxx11_((string *)&stack0xffffffffffffffc8,&this->super_LightBase);
  StringPrintf<std::__cxx11::string,pbrt::DenselySampledSpectrum_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ SpotLight %s Iemit: %s cosFalloffStart: %f cosFalloffEnd: %f ]",
             &stack0xffffffffffffffc8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->Iemit,
             (DenselySampledSpectrum *)&this->cosFalloffStart,&this->cosFalloffEnd,
             (float *)in_stack_ffffffffffffffc8._M_p);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

std::string SpotLight::ToString() const {
    return StringPrintf(
        "[ SpotLight %s Iemit: %s cosFalloffStart: %f cosFalloffEnd: %f ]",
        BaseToString(), Iemit, cosFalloffStart, cosFalloffEnd);
}